

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O2

void cftmdl(size_t n,size_t l,float *a,float *w)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  ulong uVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  lVar1 = l * 0xc;
  for (uVar7 = 0; uVar7 < l; uVar7 = uVar7 + 2) {
    fVar18 = (float)*(undefined8 *)(a + uVar7);
    fVar19 = (float)((ulong)*(undefined8 *)(a + uVar7) >> 0x20);
    fVar20 = (float)*(undefined8 *)(a + l + uVar7);
    fVar16 = fVar18 + fVar20;
    fVar14 = (float)((ulong)*(undefined8 *)(a + l + uVar7) >> 0x20);
    fVar17 = fVar19 + fVar14;
    fVar18 = fVar18 - fVar20;
    fVar19 = fVar19 - fVar14;
    fVar20 = (float)*(undefined8 *)(a + l * 2 + uVar7);
    fVar21 = (float)((ulong)*(undefined8 *)(a + l * 2 + uVar7) >> 0x20);
    fVar23 = (float)*(undefined8 *)(a + l * 3 + uVar7);
    fVar14 = fVar20 - fVar23;
    fVar22 = (float)((ulong)*(undefined8 *)(a + l * 3 + uVar7) >> 0x20);
    fVar15 = fVar21 - fVar22;
    fVar20 = fVar20 + fVar23;
    fVar21 = fVar21 + fVar22;
    *(ulong *)(a + uVar7) = CONCAT44(fVar17 + fVar21,fVar16 + fVar20);
    *(ulong *)(a + l * 2 + uVar7) = CONCAT44(fVar17 - fVar21,fVar16 - fVar20);
    a[l + uVar7] = fVar18 - fVar15;
    a[l + uVar7 + 1] = fVar19 + fVar14;
    a[l * 3 + uVar7] = fVar15 + fVar18;
    a[l * 3 + uVar7 + 1] = fVar19 - fVar14;
  }
  fVar20 = w[2];
  for (lVar3 = 0; l * 4 + lVar3 < l * 5; lVar3 = lVar3 + 2) {
    fVar15 = a[l * 4 + lVar3 + 1] - a[l * 5 + lVar3 + 1];
    fVar16 = a[l * 6 + lVar3 + 1] - a[l * 7 + lVar3 + 1];
    fVar21 = a[l * 6 + lVar3] - a[l * 7 + lVar3];
    fVar17 = a[l * 5 + lVar3 + 1] + a[l * 4 + lVar3 + 1];
    fVar18 = a[l * 7 + lVar3] + a[l * 6 + lVar3];
    fVar14 = a[l * 4 + lVar3] - a[l * 5 + lVar3];
    fVar19 = a[l * 7 + lVar3 + 1] + a[l * 6 + lVar3 + 1];
    fVar23 = a[l * 5 + lVar3] + a[l * 4 + lVar3];
    *(ulong *)(a + l * 4 + lVar3) = CONCAT44(fVar17 + fVar19,fVar18 + fVar23);
    *(ulong *)(a + l * 6 + lVar3) = CONCAT44(fVar23 - fVar18,fVar19 - fVar17);
    fVar17 = fVar14 - fVar16;
    fVar18 = fVar15 + fVar21;
    a[l * 5 + lVar3] = (fVar17 - fVar18) * fVar20;
    a[l * 5 + lVar3 + 1] = (fVar18 + fVar17) * fVar20;
    fVar14 = fVar14 + fVar16;
    fVar21 = fVar21 - fVar15;
    a[l * 7 + lVar3] = (fVar21 - fVar14) * fVar20;
    a[l * 7 + lVar3 + 1] = (fVar21 + fVar14) * fVar20;
  }
  pfVar9 = a + l * 9;
  pfVar4 = a + l * 0xb;
  pfVar12 = a + l * 10;
  pfVar13 = a + l * 8;
  pfVar10 = a + l * 0xd;
  pfVar11 = a + l * 0xf;
  pfVar5 = a + l * 0xe;
  pfVar6 = a + l * 0xc;
  uVar7 = l * 8;
  lVar3 = 0;
  for (uVar2 = uVar7; uVar2 < n; uVar2 = uVar2 + uVar7) {
    fVar20 = w[lVar3 + 2];
    fVar14 = w[lVar3 + 3];
    fVar21 = w[lVar3 * 2 + 4];
    fVar15 = w[lVar3 * 2 + 5];
    fVar17 = fVar21 - (fVar14 + fVar14) * fVar15;
    fVar18 = (fVar14 + fVar14) * fVar21 - fVar15;
    fVar16 = -fVar14;
    for (lVar8 = 0; uVar2 + lVar8 < uVar2 + l; lVar8 = lVar8 + 2) {
      fVar22 = (float)*(undefined8 *)(pfVar13 + lVar8);
      fVar24 = (float)((ulong)*(undefined8 *)(pfVar13 + lVar8) >> 0x20);
      fVar25 = (float)*(undefined8 *)(pfVar9 + lVar8);
      fVar28 = fVar22 + fVar25;
      fVar26 = (float)((ulong)*(undefined8 *)(pfVar9 + lVar8) >> 0x20);
      fVar30 = fVar24 + fVar26;
      fVar19 = (float)*(undefined8 *)(pfVar12 + lVar8);
      fVar23 = (float)((ulong)*(undefined8 *)(pfVar12 + lVar8) >> 0x20);
      fVar27 = (float)*(undefined8 *)(pfVar4 + lVar8);
      fVar31 = fVar19 + fVar27;
      fVar29 = (float)((ulong)*(undefined8 *)(pfVar4 + lVar8) >> 0x20);
      fVar32 = fVar23 + fVar29;
      *(ulong *)(pfVar13 + lVar8) = CONCAT44(fVar30 + fVar32,fVar28 + fVar31);
      fVar28 = fVar28 - fVar31;
      fVar30 = fVar30 - fVar32;
      *(ulong *)(pfVar12 + lVar8) =
           CONCAT44(fVar28 * fVar14 + fVar20 * fVar30,fVar30 * fVar16 + fVar20 * fVar28);
      fVar22 = fVar22 - fVar25;
      fVar24 = fVar24 - fVar26;
      fVar19 = fVar19 - fVar27;
      fVar23 = fVar23 - fVar29;
      fVar25 = fVar22 - fVar23;
      fVar26 = fVar24 - fVar19;
      fVar23 = fVar23 + fVar22;
      fVar19 = fVar19 + fVar24;
      *(ulong *)(pfVar9 + lVar8) =
           CONCAT44(fVar25 * fVar15 + fVar19 * fVar21,fVar19 * -fVar15 + fVar25 * fVar21);
      *(ulong *)(pfVar4 + lVar8) =
           CONCAT44(fVar23 * fVar18 + fVar26 * fVar17,fVar26 * -fVar18 + fVar23 * fVar17);
    }
    fVar14 = w[lVar3 * 2 + 6];
    fVar21 = w[lVar3 * 2 + 7];
    fVar15 = fVar14 - (fVar20 + fVar20) * fVar21;
    fVar17 = (fVar20 + fVar20) * fVar14 - fVar21;
    for (lVar8 = 0; (ulong)(lVar1 + lVar8) < uVar2 + l * 5; lVar8 = lVar8 + 2) {
      fVar23 = (float)*(undefined8 *)(pfVar6 + lVar8);
      fVar22 = (float)((ulong)*(undefined8 *)(pfVar6 + lVar8) >> 0x20);
      fVar24 = (float)*(undefined8 *)(pfVar10 + lVar8);
      fVar26 = fVar23 + fVar24;
      fVar25 = (float)((ulong)*(undefined8 *)(pfVar10 + lVar8) >> 0x20);
      fVar28 = fVar22 + fVar25;
      fVar18 = (float)*(undefined8 *)(pfVar5 + lVar8);
      fVar19 = (float)((ulong)*(undefined8 *)(pfVar5 + lVar8) >> 0x20);
      fVar30 = (float)*(undefined8 *)(pfVar11 + lVar8);
      fVar29 = fVar18 + fVar30;
      fVar27 = (float)((ulong)*(undefined8 *)(pfVar11 + lVar8) >> 0x20);
      fVar31 = fVar19 + fVar27;
      *(ulong *)(pfVar6 + lVar8) = CONCAT44(fVar28 + fVar31,fVar26 + fVar29);
      fVar26 = fVar26 - fVar29;
      fVar28 = fVar28 - fVar31;
      *(ulong *)(pfVar5 + lVar8) =
           CONCAT44(fVar26 * fVar20 + fVar16 * fVar28,fVar28 * -fVar20 + fVar16 * fVar26);
      fVar23 = fVar23 - fVar24;
      fVar22 = fVar22 - fVar25;
      fVar18 = fVar18 - fVar30;
      fVar19 = fVar19 - fVar27;
      fVar24 = fVar23 - fVar19;
      fVar25 = fVar22 - fVar18;
      fVar19 = fVar19 + fVar23;
      fVar18 = fVar18 + fVar22;
      *(ulong *)(pfVar10 + lVar8) =
           CONCAT44(fVar24 * fVar21 + fVar18 * fVar14,fVar18 * -fVar21 + fVar24 * fVar14);
      *(ulong *)(pfVar11 + lVar8) =
           CONCAT44(fVar19 * fVar17 + fVar25 * fVar15,fVar25 * -fVar17 + fVar19 * fVar15);
    }
    pfVar9 = pfVar9 + l * 8;
    pfVar4 = pfVar4 + l * 8;
    pfVar12 = pfVar12 + l * 8;
    pfVar13 = pfVar13 + l * 8;
    pfVar10 = pfVar10 + l * 8;
    pfVar11 = pfVar11 + l * 8;
    pfVar5 = pfVar5 + l * 8;
    pfVar6 = pfVar6 + l * 8;
    lVar1 = lVar1 + uVar7;
    lVar3 = lVar3 + 2;
  }
  return;
}

Assistant:

static void cftmdl(size_t n, size_t l, float *a, float *w)
{
    size_t j, j1, j2, j3, k, k1, k2, m, m2;
    float wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    m = l << 2;
    for (j = 0; j < l; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x0r - x2r;
        a[j2 + 1] = x0i - x2i;
        a[j1] = x1r - x3i;
        a[j1 + 1] = x1i + x3r;
        a[j3] = x1r + x3i;
        a[j3 + 1] = x1i - x3r;
    }
    wk1r = w[2];
    for (j = m; j < l + m; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x2i - x0i;
        a[j2 + 1] = x0r - x2r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j1] = wk1r * (x0r - x0i);
        a[j1 + 1] = wk1r * (x0r + x0i);
        x0r = x3i + x1r;
        x0i = x3r - x1i;
        a[j3] = wk1r * (x0i - x0r);
        a[j3 + 1] = wk1r * (x0i + x0r);
    }
    k1 = 0;
    m2 = 2 * m;
    for (k = m2; k < n; k += m2) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        for (j = k; j < l + k; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = wk2r * x0r - wk2i * x0i;
            a[j2 + 1] = wk2r * x0i + wk2i * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        for (j = k + m; j < l + (k + m); j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = -wk2i * x0r - wk2r * x0i;
            a[j2 + 1] = -wk2i * x0i + wk2r * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
    }
}